

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

TagBit * __thiscall Qentem::Array<Qentem::Tags::TagBit>::allocate(Array<Qentem::Tags::TagBit> *this)

{
  int *piVar1;
  TagBit *pTVar2;
  long lVar3;
  ulong uVar4;
  
  pTVar2 = (TagBit *)operator_new((ulong)this->capacity_ << 4);
  if (MemoryRecord::AddAllocation(void*)::storage == '\0') {
    allocate();
  }
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  *MemoryRecord::AddAllocation(void*)::storage = *MemoryRecord::AddAllocation(void*)::storage + 1;
  piVar1[2] = piVar1[2] + 1;
  lVar3 = malloc_usable_size(pTVar2);
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  uVar4 = lVar3 + *(long *)(MemoryRecord::AddAllocation(void*)::storage + 4);
  *(ulong *)(MemoryRecord::AddAllocation(void*)::storage + 4) = uVar4;
  if (*(ulong *)(piVar1 + 6) < uVar4) {
    *(ulong *)(piVar1 + 6) = uVar4;
  }
  this->storage_ = pTVar2;
  return pTVar2;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }